

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O2

void __thiscall ByteData_SplitData_Test::TestBody(ByteData_SplitData_Test *this)

{
  bool bVar1;
  pointer message;
  char *pcVar2;
  char *in_R9;
  initializer_list<unsigned_int> __l;
  AssertHelper local_98;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertHelper local_60;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> list;
  ByteData sub_data;
  ByteData data;
  
  std::__cxx11::string::string
            ((string *)&gtest_ar_1,"00112233444444444444444444444444444444444444444455555555",
             (allocator *)&sub_data);
  cfd::core::ByteData::ByteData(&data,(string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::ByteData::SplitData(&sub_data,&data,4);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,&sub_data);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&list,"\"00112233\"","sub_data.GetHex()",(char (*) [9])0x4ba0c2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if ((char)list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      message = "";
    }
    else {
      message = ((list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->data_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0xf4,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x14000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_ar_2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar_1,__l,
             (allocator_type *)&local_98);
  cfd::core::ByteData::SplitData
            (&list,&data,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar_1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar_1);
  local_98.data_._0_4_ = 2;
  gtest_ar_2._0_8_ =
       ((long)list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       CONCAT71(list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_start._1_7_,
                (char)list.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data._M_start)) / 0x18;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_1,"2","list.size()",(int *)&local_98,(unsigned_long *)&gtest_ar_2
            );
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  if ((long)list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)CONCAT71(list.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                     (char)list.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start) == 0x30) {
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&gtest_ar_1,
               (ByteData *)
               CONCAT71(list.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        (char)list.
                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                              ._M_impl.super__Vector_impl_data._M_start));
    testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
              ((internal *)&gtest_ar_2,"\"00112233\"","list[0].GetHex()",(char (*) [9])0x4ba0c2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xf8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&gtest_ar_1,
               (ByteData *)
               (CONCAT71(list.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)list.
                               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0x18));
    testing::internal::CmpHelperEQ<char[41],std::__cxx11::string>
              ((internal *)&gtest_ar_2,"\"4444444444444444444444444444444444444444\"",
               "list[1].GetHex()",(char (*) [41])0x422181,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xf9,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    bVar1 = cfd::core::ByteData::operator==
                      (&sub_data,
                       (ByteData *)
                       CONCAT71(list.
                                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                (char)list.
                                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
    gtest_ar_2.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_2.success_ = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar_2,
                 (AssertionResult *)"sub_data == list[0]","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xfa,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_98);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    bVar1 = cfd::core::ByteData::operator==
                      (&sub_data,
                       (ByteData *)
                       (CONCAT71(list.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (char)list.
                                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                       ._M_impl.super__Vector_impl_data._M_start) + 0x18));
    gtest_ar_2.success_ = !bVar1;
    gtest_ar_2.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar_2,
                 (AssertionResult *)"sub_data == list[1]","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xfb,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_98);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&list);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sub_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  return;
}

Assistant:

TEST(ByteData, SplitData) {
  ByteData data("00112233444444444444444444444444444444444444444455555555");
  auto sub_data = data.SplitData(4);
  EXPECT_EQ("00112233", sub_data.GetHex());
  auto list = data.SplitData(std::vector<uint32_t>{4, 20});
  EXPECT_EQ(2, list.size());
  if (list.size() == 2) {
    EXPECT_EQ("00112233", list[0].GetHex());
    EXPECT_EQ("4444444444444444444444444444444444444444", list[1].GetHex());
    EXPECT_TRUE(sub_data == list[0]);
    EXPECT_FALSE(sub_data == list[1]);
  }
}